

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# car-cdr.c
# Opt level: O0

LispPTR N_OP_car(LispPTR tos)

{
  LispPTR *pLVar1;
  ConsCell *temp;
  ConsCell *datum68k;
  LispPTR tos_local;
  
  pLVar1 = NativeAligned4FromLAddr(tos);
  if ((*(ushort *)((ulong)(MDStypetbl + (tos >> 9)) ^ 2) & 0x7ff) == 5) {
    if (*pLVar1 >> 0x1c == 0) {
      pLVar1 = NativeAligned4FromLAddr(*pLVar1 & 0xfffffff);
      datum68k._4_4_ = *pLVar1 & 0xfffffff;
    }
    else {
      datum68k._4_4_ = *pLVar1 & 0xfffffff;
    }
  }
  else {
    datum68k._4_4_ = tos;
    if ((tos != 0) && (tos != 0x4c)) {
      MachineState.errorexit = 1;
      datum68k._4_4_ = 0xffffffff;
      MachineState.tosvalue = tos;
    }
  }
  return datum68k._4_4_;
}

Assistant:

LispPTR N_OP_car(LispPTR tos) {
  ConsCell *datum68k;
  ConsCell *temp;

  datum68k = (ConsCell *)(NativeAligned4FromLAddr(tos));
  if (Listp(tos)) {
    if (datum68k->cdr_code == CDR_INDIRECT) {
      temp = (ConsCell *)NativeAligned4FromLAddr(datum68k->car_field);
      return ((LispPTR)temp->car_field);
    } else
      return ((LispPTR)datum68k->car_field);
  } else if (tos == NIL_PTR)
    return (tos);
  else if (tos == ATOM_T)
    return (tos);
  else {
    ERROR_EXIT(tos);
  }
}